

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinside.cpp
# Opt level: O1

JoinSide duckdb::JoinSide::GetJoinSide
                   (Expression *expression,
                   unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *left_bindings,
                   unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *right_bindings)

{
  ExpressionType EVar1;
  pointer puVar2;
  pointer pCVar3;
  ulong uVar4;
  JoinSide JVar5;
  JoinSide JVar6;
  BoundColumnRefExpression *pBVar7;
  BoundSubqueryExpression *pBVar8;
  type expression_00;
  Binder *pBVar9;
  NotImplementedException *this;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *right_bindings_00;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *extraout_RDX;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *extraout_RDX_00;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *right_bindings_01;
  JoinValue JVar10;
  JoinSide JVar12;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer this_00;
  CorrelatedColumnInfo *corr;
  pointer pCVar13;
  bool bVar14;
  JoinSide join_side;
  JoinValue local_59;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  JoinValue JVar11;
  
  EVar1 = (expression->super_BaseExpression).type;
  if (EVar1 == SUBQUERY) {
    pBVar8 = BaseExpression::Cast<duckdb::BoundSubqueryExpression>
                       (&expression->super_BaseExpression);
    puVar2 = (pBVar8->children).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    JVar10 = NONE;
    JVar11 = NONE;
    for (this_00 = (pBVar8->children).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar2;
        this_00 = this_00 + 1) {
      expression_00 =
           unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this_00);
      JVar5 = GetJoinSide(expression_00,left_bindings,right_bindings);
      JVar12 = JVar5;
      JVar6 = JVar5;
      if (((JVar10 != NONE) && (JVar12.value = JVar10, JVar6.value = JVar11, JVar5.value != NONE))
         && (JVar12.value = JVar11, JVar10 != JVar5.value)) {
        JVar12.value = BOTH;
        JVar6.value = BOTH;
      }
      JVar10 = JVar12.value;
      JVar11 = JVar6.value;
    }
    pBVar9 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar8->binder);
    pCVar3 = (pBVar9->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             .
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    right_bindings_01 = extraout_RDX;
    for (pCVar13 = (pBVar9->correlated_columns).
                   super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   .
                   super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start; bVar14 = pCVar13 != pCVar3, bVar14;
        pCVar13 = pCVar13 + 1) {
      uVar4 = pCVar13->depth;
      if (uVar4 < 2) {
        JVar6 = GetJoinSide((pCVar13->binding).table_index,left_bindings,right_bindings_01);
        right_bindings_01 = extraout_RDX_00;
        JVar12 = JVar6;
        if (((JVar10 != NONE) && (JVar12.value = JVar10, JVar6.value != NONE)) &&
           (JVar10 != JVar6.value)) {
          JVar12.value = BOTH;
        }
      }
      else {
        local_59 = BOTH;
        JVar12.value = JVar10;
      }
      JVar10 = JVar12.value;
      if (1 < uVar4) break;
    }
    if (!bVar14) {
      local_59 = JVar10;
    }
  }
  else if (EVar1 == BOUND_COLUMN_REF) {
    pBVar7 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                       (&expression->super_BaseExpression);
    if (pBVar7->depth != 0) {
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_58._M_unused._M_object = &local_48;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Non-inner join on correlated columns not supported","");
      NotImplementedException::NotImplementedException(this,(string *)&local_58);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_59 = (JoinValue)GetJoinSide((pBVar7->binding).table_index,left_bindings,right_bindings_00)
    ;
  }
  else {
    local_59 = NONE;
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = operator_new(0x18);
    *(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      **)local_58._M_unused._0_8_ = left_bindings;
    *(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      **)((long)local_58._M_unused._0_8_ + 8) = right_bindings;
    *(JoinValue **)((long)local_58._M_unused._0_8_ + 0x10) = &local_59;
    pcStack_40 = ::std::
                 _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/joinside.cpp:89:52)>
                 ::_M_invoke;
    local_48 = ::std::
               _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/joinside.cpp:89:52)>
               ::_M_manager;
    ExpressionIterator::EnumerateChildren
              (expression,(function<void_(duckdb::Expression_&)> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
  }
  return (JoinSide)local_59;
}

Assistant:

JoinSide JoinSide::GetJoinSide(Expression &expression, const unordered_set<idx_t> &left_bindings,
                               const unordered_set<idx_t> &right_bindings) {
	if (expression.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &colref = expression.Cast<BoundColumnRefExpression>();
		if (colref.depth > 0) {
			throw NotImplementedException("Non-inner join on correlated columns not supported");
		}
		return GetJoinSide(colref.binding.table_index, left_bindings, right_bindings);
	}
	D_ASSERT(expression.GetExpressionType() != ExpressionType::BOUND_REF);
	if (expression.GetExpressionType() == ExpressionType::SUBQUERY) {
		D_ASSERT(expression.GetExpressionClass() == ExpressionClass::BOUND_SUBQUERY);
		auto &subquery = expression.Cast<BoundSubqueryExpression>();
		JoinSide side = JoinSide::NONE;
		for (auto &child : subquery.children) {
			auto child_side = GetJoinSide(*child, left_bindings, right_bindings);
			side = CombineJoinSide(side, child_side);
		}
		// correlated subquery, check the side of each of correlated columns in the subquery
		for (auto &corr : subquery.binder->correlated_columns) {
			if (corr.depth > 1) {
				// correlated column has depth > 1
				// it does not refer to any table in the current set of bindings
				return JoinSide::BOTH;
			}
			auto correlated_side = GetJoinSide(corr.binding.table_index, left_bindings, right_bindings);
			side = CombineJoinSide(side, correlated_side);
		}
		return side;
	}
	JoinSide join_side = JoinSide::NONE;
	ExpressionIterator::EnumerateChildren(expression, [&](Expression &child) {
		auto child_side = GetJoinSide(child, left_bindings, right_bindings);
		join_side = CombineJoinSide(child_side, join_side);
	});
	return join_side;
}